

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalNestedLoopJoin::Sink
          (PhysicalNestedLoopJoin *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  DataChunk *this_00;
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  bool bVar3;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  this_00 = (DataChunk *)(pLVar2 + 1);
  DataChunk::Reset(this_00);
  ExpressionExecutor::Execute
            ((ExpressionExecutor *)&pLVar2[2].partition_info.min_batch_index,chunk,this_00);
  if (((this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
       field_0x81 == '\a') && (((ulong)pGVar1[4]._vptr_GlobalSinkState & 1) == 0)) {
    bVar3 = PhysicalJoin::HasNullValues(this_00);
    if (bVar3) {
      LOCK();
      *(undefined1 *)&pGVar1[4]._vptr_GlobalSinkState = 1;
      UNLOCK();
    }
  }
  ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(pGVar1 + 1))->__data);
  ColumnDataCollection::Append
            ((ColumnDataCollection *)
             &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
             ,chunk);
  ColumnDataCollection::Append
            ((ColumnDataCollection *)
             ((long)&pGVar1[2].super_StateWithBlockableTasks.blocked_tasks.
                     super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                     super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                     ._M_impl.super__Vector_impl_data + 8),this_00);
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar1 + 1));
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalNestedLoopJoin::Sink(ExecutionContext &context, DataChunk &chunk,
                                            OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<NestedLoopJoinGlobalState>();
	auto &nlj_state = input.local_state.Cast<NestedLoopJoinLocalState>();

	// resolve the join expression of the right side
	nlj_state.right_condition.Reset();
	nlj_state.rhs_executor.Execute(chunk, nlj_state.right_condition);

	// if we have not seen any NULL values yet, and we are performing a MARK join, check if there are NULL values in
	// this chunk
	if (join_type == JoinType::MARK && !gstate.has_null) {
		if (HasNullValues(nlj_state.right_condition)) {
			gstate.has_null = true;
		}
	}

	// append the payload data and the conditions
	lock_guard<mutex> nj_guard(gstate.nj_lock);
	gstate.right_payload_data.Append(chunk);
	gstate.right_condition_data.Append(nlj_state.right_condition);
	return SinkResultType::NEED_MORE_INPUT;
}